

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_6c2d2::testIntersect
               (Line3f *line,V3f *v0,V3f *v1,V3f *v2,V3f *point,bool front,bool returnValue)

{
  bool bVar1;
  Vec3<float> *in_RCX;
  Vec3<float> *in_RDX;
  Vec3<float> *in_RSI;
  byte in_R9B;
  byte in_stack_00000008;
  V3f pt2;
  float e;
  bool rv;
  bool fr;
  Vec3<float> *in_stack_00000060;
  V3f bary;
  V3f pt;
  Vec3<float> *in_stack_ffffffffffffff78;
  byte local_45;
  Vec3<float> local_44;
  Vec3<float> local_38;
  byte local_2a;
  byte local_29;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  Imath_3_2::Vec3<float>::Vec3(&local_38);
  Imath_3_2::Vec3<float>::Vec3(&local_44);
  bVar1 = Imath_3_2::intersect<float>
                    ((Line3<float> *)v2,point,
                     (Vec3<float> *)CONCAT17(front,CONCAT16(returnValue,stack0x00000078)),
                     (Vec3<float> *)pt._0_8_,(Vec3<float> *)bary._4_8_,in_stack_00000060,
                     (bool *)line);
  if (bVar1 != (bool)(local_2a & 1)) {
    __assert_fail("rv == returnValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0x9d,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  std::numeric_limits<float>::epsilon();
  if (bVar1) {
    if ((local_29 & 1) != (local_45 & 1)) {
      __assert_fail("front == fr",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa3,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
    bVar1 = Imath_3_2::Vec3<float>::equalWithAbsError
                      (in_stack_ffffffffffffff78,in_RSI,(float)((ulong)in_RDX >> 0x20));
    if (!bVar1) {
      __assert_fail("pt.equalWithAbsError (point, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa4,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
    Imath_3_2::Vec3<float>::operator*(in_RDX,(float)((ulong)in_RCX >> 0x20));
    Imath_3_2::Vec3<float>::operator*(in_RDX,(float)((ulong)in_RCX >> 0x20));
    Imath_3_2::Vec3<float>::operator+(in_RDX,in_RCX);
    Imath_3_2::Vec3<float>::operator*(in_RDX,(float)((ulong)in_RCX >> 0x20));
    Imath_3_2::Vec3<float>::operator+(in_RDX,in_RCX);
    bVar1 = Imath_3_2::Vec3<float>::equalWithAbsError
                      (in_stack_ffffffffffffff78,in_RSI,(float)((ulong)in_RDX >> 0x20));
    if (!bVar1) {
      __assert_fail("pt.equalWithAbsError (pt2, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
  }
  return;
}

Assistant:

void
testIntersect (
    const Line3f& line,
    const V3f&    v0,
    const V3f&    v1,
    const V3f&    v2,
    const V3f&    point,
    bool          front,
    bool          returnValue)
{
    V3f  pt;
    V3f  bary;
    bool fr;

    bool rv = intersect (line, v0, v1, v2, pt, bary, fr);

    assert (rv == returnValue);

    float e = 10 * std::numeric_limits<float>::epsilon ();

    if (rv)
    {
        assert (front == fr);
        assert (pt.equalWithAbsError (point, e));
        V3f pt2 = v0 * bary.x + v1 * bary.y + v2 * bary.z;
        assert (pt.equalWithAbsError (pt2, e));
    }
}